

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_diag_sse2_128_64.c
# Opt level: O3

parasail_result_t *
parasail_sg_flags_diag_sse2_128_64
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  int *piVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  uint uVar6;
  parasail_result_t *ppVar7;
  int64_t *ptr;
  int64_t *ptr_00;
  int64_t *ptr_01;
  int64_t *ptr_02;
  long lVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  bool bVar18;
  int iVar19;
  int64_t iVar20;
  ulong uVar21;
  __m128i_64_t B_1;
  long lVar24;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  __m128i_64_t B_2;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  uint uVar30;
  int iVar39;
  __m128i_64_t A_1;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  __m128i_64_t A;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  int iVar42;
  int iVar53;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  int64_t iVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  __m128i_64_t B_5;
  __m128i_64_t B_4;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  int iVar69;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  int iVar70;
  int iVar75;
  int iVar76;
  int iVar78;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  int iVar77;
  int iVar79;
  undefined1 auVar74 [16];
  undefined1 local_1b8 [16];
  long lStack_1a0;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_148 [16];
  undefined1 local_118 [16];
  undefined8 local_108;
  long local_100;
  int *local_f8;
  long local_f0;
  long local_e8;
  ulong local_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  long local_88;
  undefined8 uStack_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  int local_58;
  undefined4 uStack_54;
  int iStack_50;
  undefined4 uStack_4c;
  long local_48;
  long lStack_40;
  
  if (_s2 == (char *)0x0) {
    parasail_sg_flags_diag_sse2_128_64_cold_7();
    return (parasail_result_t *)0x0;
  }
  if (s2Len < 1) {
    parasail_sg_flags_diag_sse2_128_64_cold_6();
    return (parasail_result_t *)0x0;
  }
  if (open < 0) {
    parasail_sg_flags_diag_sse2_128_64_cold_5();
    return (parasail_result_t *)0x0;
  }
  if (gap < 0) {
    parasail_sg_flags_diag_sse2_128_64_cold_4();
    return (parasail_result_t *)0x0;
  }
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_sg_flags_diag_sse2_128_64_cold_3();
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 0) {
    if (_s1 == (char *)0x0) {
      parasail_sg_flags_diag_sse2_128_64_cold_2();
      return (parasail_result_t *)0x0;
    }
    if (_s1Len < 1) {
      parasail_sg_flags_diag_sse2_128_64_cold_1();
      return (parasail_result_t *)0x0;
    }
  }
  else {
    _s1Len = matrix->length;
  }
  iVar39 = matrix->min;
  iVar19 = -open;
  uVar12 = 0x8000000000000000 - (long)iVar39;
  if (iVar39 != iVar19 && SBORROW4(iVar39,iVar19) == iVar39 + open < 0) {
    uVar12 = (ulong)(uint)open | 0x8000000000000000;
  }
  lVar9 = uVar12 + 1;
  lVar15 = 0x7ffffffffffffffe - (long)matrix->max;
  auVar29._8_4_ = (int)lVar9;
  auVar29._0_8_ = lVar9;
  auVar29._12_4_ = (int)((ulong)lVar9 >> 0x20);
  lVar11 = (long)_s1Len;
  local_e8 = lVar11 + -1;
  uVar21 = (ulong)(uint)s2Len;
  local_d8 = (undefined1  [16])0x0;
  local_168 = (undefined1  [16])0x0;
  if (s1_beg == 0) {
    local_d8._4_4_ = 0;
    local_d8._0_4_ = gap * 2;
    local_d8._8_4_ = gap * 2;
    local_d8._12_4_ = 0;
  }
  lStack_1a0 = auVar29._8_8_;
  local_98._8_8_ = lStack_1a0;
  local_98._0_8_ = lVar9;
  local_a8._8_8_ = lStack_1a0;
  local_a8._0_8_ = lVar9;
  local_b8._8_8_ = lStack_1a0;
  local_b8._0_8_ = lVar9;
  local_118._8_8_ = lStack_1a0;
  local_118._0_8_ = lVar9;
  local_c8._8_8_ = lStack_1a0;
  local_c8._0_8_ = lVar9;
  if (s1_beg == 0) {
    local_168._8_8_ = (long)iVar19;
    local_168._0_8_ = (long)(iVar19 - gap);
  }
  ppVar7 = parasail_result_new();
  if (ppVar7 == (parasail_result_t *)0x0) {
    return (parasail_result_t *)0x0;
  }
  ppVar7->flag = (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar7->flag | 0x2801002;
  uVar13 = (ulong)(s2Len + 2);
  local_108 = uVar12;
  ptr = parasail_memalign_int64_t(0x10,uVar13);
  ptr_00 = parasail_memalign_int64_t(0x10,uVar13);
  ptr_01 = parasail_memalign_int64_t(0x10,uVar13);
  if (ptr_01 == (int64_t *)0x0 || (ptr_00 == (int64_t *)0x0 || ptr == (int64_t *)0x0)) {
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 0) {
    ptr_02 = parasail_memalign_int64_t(0x10,(long)(_s1Len + 1));
    if (ptr_02 == (int64_t *)0x0) {
      return (parasail_result_t *)0x0;
    }
    if (0 < _s1Len) {
      piVar1 = matrix->mapper;
      lVar17 = 0;
      do {
        ptr_02[lVar17] = (long)piVar1[(byte)_s1[lVar17]];
        lVar17 = lVar17 + 1;
      } while (lVar11 != lVar17);
    }
    ptr_02[lVar11] = 0;
  }
  else {
    ptr_02 = (int64_t *)0x0;
  }
  local_88 = lVar15;
  uStack_80 = 0;
  uVar30 = (uint)lVar15;
  iVar39 = (int)((ulong)lVar15 >> 0x20);
  local_148._8_4_ = uVar30;
  local_148._0_8_ = lVar15;
  local_148._12_4_ = iVar39;
  local_58 = open;
  uStack_54 = 0;
  iStack_50 = open;
  uStack_4c = 0;
  local_68._0_8_ = CONCAT44(0,gap);
  local_68._8_4_ = gap;
  local_68._12_4_ = 0;
  auVar4 = local_68;
  piVar1 = matrix->mapper;
  uVar12 = 0;
  do {
    ptr[uVar12 + 1] = (long)piVar1[(byte)_s2[uVar12]];
    uVar12 = uVar12 + 1;
  } while (uVar21 != uVar12);
  *ptr = 0;
  ptr[uVar21 + 1] = 0;
  lVar15 = (long)iVar19;
  if (s2_beg == 0) {
    uVar12 = 0;
    lVar17 = lVar15;
    do {
      ptr_00[uVar12 + 1] = lVar17;
      ptr_01[uVar12 + 1] = lVar9;
      uVar12 = uVar12 + 1;
      lVar17 = lVar17 - (ulong)(uint)gap;
    } while (uVar21 != uVar12);
  }
  else {
    uVar12 = 0;
    do {
      ptr_00[uVar12 + 1] = 0;
      ptr_01[uVar12 + 1] = lVar9;
      uVar12 = uVar12 + 1;
    } while (uVar21 != uVar12);
  }
  *ptr_01 = lVar9;
  ptr_00[uVar21 + 1] = lVar9;
  ptr_01[uVar21 + 1] = lVar9;
  *ptr_00 = 0;
  auVar22 = _DAT_00904920;
  local_b8 = auVar29;
  local_c8 = auVar29;
  local_a8 = auVar29;
  local_118 = auVar29;
  local_98 = auVar29;
  local_178 = auVar29;
  if (0 < _s1Len) {
    local_f0 = lVar15;
    local_f8 = matrix->matrix;
    local_100 = (long)matrix->size;
    iVar16 = matrix->type;
    local_78 = auVar29 >> 0x40;
    local_1b8 = ZEXT416(1);
    local_e0 = 0;
    do {
      uVar10 = (uint)local_e0;
      if (iVar16 == 0) {
        uVar12 = ptr_02[local_e0];
        iVar20 = ptr_02[local_e0 + 1];
      }
      else {
        uVar6 = uVar10 | 1;
        if (lVar11 <= (long)(local_e0 | 1)) {
          uVar6 = _s1Len - 1;
        }
        iVar20 = (int64_t)(int)uVar6;
        uVar12 = local_e0;
      }
      local_e0 = local_e0 + 2;
      iVar14 = iVar19 - uVar10 * gap;
      iVar54 = *ptr_00;
      *ptr_00 = lVar15 - local_e0 * (uint)gap;
      local_48 = -(ulong)(local_1b8._0_8_ == local_e8);
      lStack_40 = -(ulong)(local_1b8._8_8_ == local_e8);
      if (s1_beg != 0) {
        iVar14 = 0;
      }
      auVar44._8_8_ = (long)iVar14;
      auVar44._0_8_ = lStack_1a0;
      uVar13 = 0;
      auVar64 = ZEXT816(0xffffffffffffffff);
      auVar31 = auVar29;
      auVar58 = auVar29;
      lVar17 = lStack_1a0;
      do {
        auVar55._0_8_ = local_f8[iVar20 * local_100 + ptr[uVar13]] + lVar17;
        auVar55._8_8_ = local_f8[uVar12 * local_100 + ptr[uVar13 + 1]] + iVar54;
        lVar17 = auVar44._8_8_;
        iVar54 = ptr_00[uVar13 + 1];
        auVar43._0_8_ = lVar17 - (ulong)(uint)open;
        auVar43._8_8_ = iVar54 - (ulong)(uint)open;
        local_68._12_4_ = 0;
        auVar61._0_8_ = auVar58._8_8_ - local_68._0_8_;
        auVar61._8_8_ = ptr_01[uVar13 + 1] - local_68._8_8_;
        auVar58 = auVar61 ^ auVar22;
        auVar67 = auVar43 ^ auVar22;
        iVar14 = -(uint)(auVar58._0_4_ < auVar67._0_4_);
        iVar75 = -(uint)(auVar58._4_4_ < auVar67._4_4_);
        iVar76 = -(uint)(auVar58._8_4_ < auVar67._8_4_);
        iVar78 = -(uint)(auVar58._12_4_ < auVar67._12_4_);
        auVar68._4_4_ = -(uint)(auVar67._4_4_ == auVar58._4_4_);
        auVar68._12_4_ = -(uint)(auVar67._12_4_ == auVar58._12_4_);
        auVar59._4_4_ = iVar14;
        auVar59._0_4_ = iVar14;
        auVar59._8_4_ = iVar76;
        auVar59._12_4_ = iVar76;
        auVar68._0_4_ = auVar68._4_4_;
        auVar68._8_4_ = auVar68._12_4_;
        auVar46._0_8_ = auVar44._0_8_ - (ulong)(uint)open;
        auVar46._8_8_ = lVar17 - (ulong)(uint)open;
        auVar58._0_8_ = auVar31._0_8_ - local_68._0_8_;
        auVar58._8_8_ = auVar31._8_8_ - local_68._8_8_;
        auVar60._4_4_ = iVar75;
        auVar60._0_4_ = iVar75;
        auVar60._8_4_ = iVar78;
        auVar60._12_4_ = iVar78;
        auVar60 = auVar60 | auVar68 & auVar59;
        auVar61 = ~auVar60 & auVar61 | auVar43 & auVar60;
        auVar31 = auVar58 ^ auVar22;
        auVar44 = auVar46 ^ auVar22;
        iVar76 = -(uint)(auVar31._0_4_ < auVar44._0_4_);
        iVar78 = -(uint)(auVar31._4_4_ < auVar44._4_4_);
        iVar69 = -(uint)(auVar31._8_4_ < auVar44._8_4_);
        iVar70 = -(uint)(auVar31._12_4_ < auVar44._12_4_);
        iVar14 = -(uint)(auVar44._4_4_ == auVar31._4_4_);
        iVar75 = -(uint)(auVar44._12_4_ == auVar31._12_4_);
        auVar32._4_4_ = iVar76;
        auVar32._0_4_ = iVar76;
        auVar32._8_4_ = iVar69;
        auVar32._12_4_ = iVar69;
        auVar71._4_4_ = iVar14;
        auVar71._0_4_ = iVar14;
        auVar71._8_4_ = iVar75;
        auVar71._12_4_ = iVar75;
        auVar45._4_4_ = iVar78;
        auVar45._0_4_ = iVar78;
        auVar45._8_4_ = iVar70;
        auVar45._12_4_ = iVar70;
        auVar45 = auVar45 | auVar71 & auVar32;
        auVar46 = ~auVar45 & auVar58 | auVar46 & auVar45;
        auVar31 = auVar46 ^ auVar22;
        auVar58 = auVar55 ^ auVar22;
        iVar14 = -(uint)(auVar31._0_4_ < auVar58._0_4_);
        iVar75 = -(uint)(auVar31._4_4_ < auVar58._4_4_);
        iVar76 = -(uint)(auVar31._8_4_ < auVar58._8_4_);
        iVar78 = -(uint)(auVar31._12_4_ < auVar58._12_4_);
        auVar25._4_4_ = -(uint)(auVar58._4_4_ == auVar31._4_4_);
        auVar25._12_4_ = -(uint)(auVar58._12_4_ == auVar31._12_4_);
        auVar31._4_4_ = iVar14;
        auVar31._0_4_ = iVar14;
        auVar31._8_4_ = iVar76;
        auVar31._12_4_ = iVar76;
        auVar25._0_4_ = auVar25._4_4_;
        auVar25._8_4_ = auVar25._12_4_;
        auVar67._4_4_ = iVar75;
        auVar67._0_4_ = iVar75;
        auVar67._8_4_ = iVar78;
        auVar67._12_4_ = iVar78;
        auVar67 = auVar67 | auVar25 & auVar31;
        auVar31 = ~auVar67 & auVar46 | auVar55 & auVar67;
        auVar58 = auVar31 ^ auVar22;
        auVar44 = auVar61 ^ auVar22;
        iVar14 = -(uint)(auVar44._0_4_ < auVar58._0_4_);
        iVar75 = -(uint)(auVar44._4_4_ < auVar58._4_4_);
        iVar76 = -(uint)(auVar44._8_4_ < auVar58._8_4_);
        iVar78 = -(uint)(auVar44._12_4_ < auVar58._12_4_);
        auVar33._4_4_ = -(uint)(auVar44._4_4_ == auVar58._4_4_);
        auVar33._12_4_ = -(uint)(auVar44._12_4_ == auVar58._12_4_);
        auVar26._4_4_ = iVar14;
        auVar26._0_4_ = iVar14;
        auVar26._8_4_ = iVar76;
        auVar26._12_4_ = iVar76;
        auVar33._0_4_ = auVar33._4_4_;
        auVar33._8_4_ = auVar33._12_4_;
        auVar27._4_4_ = iVar75;
        auVar27._0_4_ = iVar75;
        auVar27._8_4_ = iVar78;
        auVar27._12_4_ = iVar78;
        auVar27 = auVar27 | auVar33 & auVar26;
        auVar52._0_4_ = -(uint)(auVar64._0_4_ == -1);
        iVar14 = auVar64._4_4_;
        lVar24 = auVar64._8_8_;
        auVar52._4_4_ = -(uint)(iVar14 == -1);
        iVar75 = auVar64._12_4_;
        auVar52._8_4_ = -(uint)(auVar64._8_4_ == -1);
        auVar52._12_4_ = -(uint)(iVar75 == -1);
        auVar56._4_4_ = auVar52._0_4_;
        auVar56._0_4_ = auVar52._4_4_;
        auVar56._8_4_ = auVar52._12_4_;
        auVar56._12_4_ = auVar52._8_4_;
        auVar56 = auVar56 & auVar52;
        auVar44 = local_168 & auVar56 | ~auVar56 & (~auVar27 & auVar61 | auVar31 & auVar27);
        auVar58 = ~auVar56 & auVar61 | auVar29 & auVar56;
        auVar31 = auVar44 ^ auVar22;
        iVar76 = auVar31._0_4_;
        iVar78 = auVar31._4_4_;
        iVar69 = auVar31._8_4_;
        iVar70 = auVar31._12_4_;
        if (1 < uVar13) {
          auVar31 = local_148 ^ auVar22;
          iVar42 = -(uint)(auVar31._0_4_ < iVar76);
          auVar47._4_4_ = -(uint)(auVar31._4_4_ < iVar78);
          iVar53 = -(uint)(auVar31._8_4_ < iVar69);
          auVar47._12_4_ = -(uint)(auVar31._12_4_ < iVar70);
          auVar72._4_4_ = iVar42;
          auVar72._0_4_ = iVar42;
          auVar72._8_4_ = iVar53;
          auVar72._12_4_ = iVar53;
          auVar34._4_4_ = -(uint)(auVar31._4_4_ == iVar78);
          auVar34._12_4_ = -(uint)(auVar31._12_4_ == iVar70);
          auVar34._0_4_ = auVar34._4_4_;
          auVar34._8_4_ = auVar34._12_4_;
          auVar47._0_4_ = auVar47._4_4_;
          auVar47._8_4_ = auVar47._12_4_;
          auVar47 = auVar47 | auVar34 & auVar72;
          local_148 = local_148 & auVar47 | ~auVar47 & auVar44;
          auVar31 = local_178 ^ auVar22;
          iVar42 = -(uint)(iVar76 < auVar31._0_4_);
          auVar48._4_4_ = -(uint)(iVar78 < auVar31._4_4_);
          iVar53 = -(uint)(iVar69 < auVar31._8_4_);
          auVar48._12_4_ = -(uint)(iVar70 < auVar31._12_4_);
          auVar73._4_4_ = iVar42;
          auVar73._0_4_ = iVar42;
          auVar73._8_4_ = iVar53;
          auVar73._12_4_ = iVar53;
          auVar35._4_4_ = -(uint)(auVar31._4_4_ == iVar78);
          auVar35._12_4_ = -(uint)(auVar31._12_4_ == iVar70);
          auVar35._0_4_ = auVar35._4_4_;
          auVar35._8_4_ = auVar35._12_4_;
          auVar48._0_4_ = auVar48._4_4_;
          auVar48._8_4_ = auVar48._12_4_;
          auVar48 = auVar48 | auVar35 & auVar73;
          local_178 = local_178 & auVar48 | ~auVar48 & auVar44;
        }
        auVar31 = auVar29 & auVar56 | ~auVar56 & auVar46;
        lVar8 = auVar64._0_8_;
        auVar57._8_8_ = -(ulong)(lVar24 == uVar21 - 1);
        auVar57._0_8_ = -(ulong)(lVar8 == uVar21 - 1);
        auVar36._8_8_ = -(ulong)(lVar24 < (long)uVar21);
        auVar36._0_8_ = -(ulong)(lVar8 < (long)uVar21);
        auVar67 = local_98 ^ auVar22;
        iVar42 = -(uint)(auVar67._0_4_ < iVar76);
        iVar53 = -(uint)(auVar67._4_4_ < iVar78);
        iVar77 = -(uint)(auVar67._8_4_ < iVar69);
        iVar79 = -(uint)(auVar67._12_4_ < iVar70);
        auVar65._4_4_ = iVar42;
        auVar65._0_4_ = iVar42;
        auVar65._8_4_ = iVar77;
        auVar65._12_4_ = iVar77;
        auVar49._4_4_ = -(uint)(auVar67._4_4_ == iVar78);
        auVar49._12_4_ = -(uint)(auVar67._12_4_ == iVar70);
        auVar49._0_4_ = auVar49._4_4_;
        auVar49._8_4_ = auVar49._12_4_;
        auVar66._4_4_ = iVar53;
        auVar66._0_4_ = iVar53;
        auVar66._8_4_ = iVar79;
        auVar66._12_4_ = iVar79;
        auVar67 = local_a8 ^ auVar22;
        iVar76 = -(uint)(auVar67._0_4_ < iVar76);
        iVar42 = -(uint)(auVar67._4_4_ < iVar78);
        iVar69 = -(uint)(auVar67._8_4_ < iVar69);
        iVar53 = -(uint)(auVar67._12_4_ < iVar70);
        auVar50._4_4_ = -(uint)(auVar67._4_4_ == iVar78);
        auVar50._12_4_ = -(uint)(auVar67._12_4_ == iVar70);
        auVar62._4_4_ = iVar76;
        auVar62._0_4_ = iVar76;
        auVar62._8_4_ = iVar69;
        auVar62._12_4_ = iVar69;
        auVar50._0_4_ = auVar50._4_4_;
        auVar50._8_4_ = auVar50._12_4_;
        auVar63._4_4_ = iVar42;
        auVar63._0_4_ = iVar42;
        auVar63._8_4_ = iVar53;
        auVar63._12_4_ = iVar53;
        auVar74._8_4_ = 0xffffffff;
        auVar74._0_8_ = 0xffffffffffffffff;
        auVar74._12_4_ = 0xffffffff;
        auVar51._0_4_ = -(uint)(-1 < iVar14);
        auVar51._4_4_ = -(uint)(-1 < iVar14);
        auVar51._8_4_ = -(uint)(-1 < iVar75);
        auVar51._12_4_ = -(uint)(-1 < iVar75);
        auVar3._8_8_ = -(ulong)(local_1b8._8_8_ == local_e8);
        auVar3._0_8_ = -(ulong)(local_1b8._0_8_ == local_e8);
        auVar52 = auVar51 & auVar36 & auVar3 & (auVar66 | auVar49 & auVar65);
        auVar2._8_8_ = -(ulong)((long)local_1b8._8_8_ < lVar11);
        auVar2._0_8_ = -(ulong)((long)local_1b8._0_8_ < lVar11);
        auVar67 = auVar2 & auVar57 & (auVar63 | auVar50 & auVar62);
        local_98 = auVar52 & auVar44 | ~auVar52 & local_98;
        local_a8 = auVar67 & auVar44 | ~auVar67 & local_a8;
        local_b8 = ~(auVar57 & auVar3) & local_b8 | auVar44 & auVar57 & auVar3;
        local_118 = auVar67 & local_1b8 | ~auVar67 & local_118;
        local_c8 = auVar52 & auVar64 | ~auVar52 & local_c8;
        ptr_00[uVar13] = auVar44._0_8_;
        ptr_01[uVar13] = auVar58._0_8_;
        auVar64._0_8_ = lVar8 + 1;
        auVar64._8_8_ = lVar24 - auVar74._8_8_;
        uVar13 = uVar13 + 1;
      } while (s2Len + 1 != uVar13);
      local_1b8._8_8_ = local_1b8._8_8_ + 2;
      local_1b8._0_8_ = local_1b8._0_8_ + 2;
      local_168._8_8_ = local_168._8_8_ - local_d8._8_8_;
      local_168._0_8_ = local_168._0_8_ - local_d8._0_8_;
    } while ((long)local_e0 < lVar11);
  }
  lVar17 = 0;
  uVar12 = 0;
  iVar19 = 0;
  lVar11 = lVar9;
  lVar15 = lVar9;
  bVar5 = true;
  do {
    bVar18 = bVar5;
    lVar24 = *(long *)(local_a8 + lVar17);
    if (lVar9 < lVar24) {
      uVar21 = *(ulong *)(local_118 + lVar17);
LAB_0056bdf9:
      uVar12 = uVar21 & 0xffffffff;
      lVar9 = lVar24;
    }
    else if ((lVar24 == lVar9) &&
            (uVar21 = *(ulong *)(local_118 + lVar17), (long)uVar21 < (long)(int)uVar12))
    goto LAB_0056bdf9;
    iVar16 = (int)uVar12;
    if (lVar15 < *(long *)(local_98 + lVar17)) {
      iVar19 = *(int *)(local_c8 + lVar17);
      lVar15 = *(long *)(local_98 + lVar17);
    }
    if (lVar11 < *(long *)(local_b8 + lVar17)) {
      lVar11 = *(long *)(local_b8 + lVar17);
    }
    lVar17 = lVar17 + 8;
    bVar5 = false;
  } while (bVar18);
  if (s1_end == 0 || s2_end == 0) {
    if (s1_end == 0) {
      iVar16 = _s1Len + -1;
      iVar14 = s2Len + -1;
      if (s2_end != 0) {
        lVar11 = lVar15;
        iVar14 = iVar19;
      }
      goto LAB_0056bef8;
    }
  }
  else if (lVar9 <= lVar15) {
    if ((lVar9 != lVar15) || (lVar11 = lVar9, iVar14 = s2Len + -1, iVar19 != s2Len + -1)) {
      iVar16 = _s1Len + -1;
      lVar11 = lVar15;
      iVar14 = iVar19;
    }
    goto LAB_0056bef8;
  }
  lVar11 = lVar9;
  iVar14 = s2Len + -1;
LAB_0056bef8:
  iVar19 = (int)lVar11;
  iVar75 = -(uint)((int)((uint)local_108 ^ 0x80000000) < (int)(local_148._0_4_ ^ 0x80000000));
  auVar37._4_4_ = -(uint)(local_108._4_4_ < (int)local_148._4_4_);
  iVar76 = -(uint)((int)((uint)local_108 ^ 0x80000000) < (int)(local_148._8_4_ ^ 0x80000000));
  auVar37._12_4_ = -(uint)(local_108._4_4_ < (int)local_148._12_4_);
  auVar40._4_4_ = iVar75;
  auVar40._0_4_ = iVar75;
  auVar40._8_4_ = iVar76;
  auVar40._12_4_ = iVar76;
  auVar22._4_4_ = -(uint)(local_108._4_4_ == local_148._4_4_);
  auVar22._12_4_ = -(uint)(local_108._4_4_ == local_148._12_4_);
  auVar22._0_4_ = auVar22._4_4_;
  auVar22._8_4_ = auVar22._12_4_;
  auVar37._0_4_ = auVar37._4_4_;
  auVar37._8_4_ = auVar37._12_4_;
  auVar23._8_4_ = 0xffffffff;
  auVar23._0_8_ = 0xffffffffffffffff;
  auVar23._12_4_ = 0xffffffff;
  iVar75 = -(uint)((int)(uVar30 ^ 0x80000000) < (int)(local_178._0_4_ ^ 0x80000000));
  auVar28._4_4_ = -(uint)(iVar39 < (int)local_178._4_4_);
  iVar76 = -(uint)((int)(uVar30 ^ 0x80000000) < (int)(local_178._8_4_ ^ 0x80000000));
  auVar28._12_4_ = -(uint)(iVar39 < (int)local_178._12_4_);
  auVar41._4_4_ = iVar75;
  auVar41._0_4_ = iVar75;
  auVar41._8_4_ = iVar76;
  auVar41._12_4_ = iVar76;
  auVar38._4_4_ = -(uint)(iVar39 == local_178._4_4_);
  auVar38._12_4_ = -(uint)(iVar39 == local_178._12_4_);
  auVar38._0_4_ = auVar38._4_4_;
  auVar38._8_4_ = auVar38._12_4_;
  auVar28._0_4_ = auVar28._4_4_;
  auVar28._8_4_ = auVar28._12_4_;
  auVar29 = auVar28 | auVar38 & auVar41 | auVar23 ^ (auVar37 | auVar22 & auVar40);
  if ((((((((((((((((auVar29 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar29 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar29 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar29 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar29 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar29 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar29 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar29 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar29 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar29 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar29 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar29 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar29 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
       (auVar29 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar29 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar29[0xf] < '\0') {
    *(byte *)&ppVar7->flag = (byte)ppVar7->flag | 0x40;
    iVar19 = 0;
    iVar14 = 0;
    iVar16 = 0;
  }
  ppVar7->score = iVar19;
  ppVar7->end_query = iVar16;
  ppVar7->end_ref = iVar14;
  local_68 = auVar4;
  parasail_free(ptr_01);
  parasail_free(ptr_00);
  parasail_free(ptr);
  if (matrix->type == 0) {
    parasail_free(ptr_02);
    return ppVar7;
  }
  return ppVar7;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int64_t * restrict s1 = NULL;
    int64_t * restrict s2B = NULL;
    int64_t * restrict _H_pr = NULL;
    int64_t * restrict _F_pr = NULL;
    int64_t * restrict s2 = NULL;
    int64_t * restrict H_pr = NULL;
    int64_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxHRow;
    __m128i vMaxHCol;
    __m128i vLastVal;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 2; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vOpen = _mm_set1_epi64x_rpl(open);
    vGap  = _mm_set1_epi64x_rpl(gap);
    vOne = _mm_set1_epi64x_rpl(1);
    vN = _mm_set1_epi64x_rpl(N);
    vGapN = s1_beg ? _mm_set1_epi64x_rpl(0) : _mm_set1_epi64x_rpl(gap*N);
    vNegOne = _mm_set1_epi64x_rpl(-1);
    vI = _mm_set_epi64x_rpl(0,1);
    vJreset = _mm_set_epi64x_rpl(0,-1);
    vMaxHRow = vNegInf;
    vMaxHCol = vNegInf;
    vLastVal = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi64x_rpl(s1Len);
    vILimit1 = _mm_sub_epi64(vILimit, vOne);
    vJLimit = _mm_set1_epi64x_rpl(s2Len);
    vJLimit1 = _mm_sub_epi64(vJLimit, vOne);
    vIBoundary = s1_beg ? _mm_set1_epi64x_rpl(0) : _mm_set_epi64x_rpl(
            -open-0*gap,
            -open-1*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int64_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int64_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    if (s2_beg) {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = 0;
            F_pr[j] = NEG_LIMIT;
        }
    }
    else {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = -open - j*gap;
            F_pr[j] = NEG_LIMIT;
        }
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf;
        __m128i vWH = vNegInf;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        __m128i vIltLimit = _mm_cmplt_epi64_rpl(vI, vILimit);
        __m128i vIeqLimit1 = _mm_cmpeq_epi64_rpl(vI, vILimit1);
        vNH = _mm_srli_si128(vNH, 8);
        vNH = _mm_insert_epi64_rpl(vNH, H_pr[-1], 1);
        vWH = _mm_srli_si128(vWH, 8);
        vWH = _mm_insert_epi64_rpl(vWH, s1_beg ? 0 : (-open - i*gap), 1);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 8);
            vNH = _mm_insert_epi64_rpl(vNH, H_pr[j], 1);
            vF = _mm_srli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, F_pr[j], 1);
            vF = _mm_max_epi64_rpl(
                    _mm_sub_epi64(vNH, vOpen),
                    _mm_sub_epi64(vF, vGap));
            vE = _mm_max_epi64_rpl(
                    _mm_sub_epi64(vWH, vOpen),
                    _mm_sub_epi64(vE, vGap));
            vMat = _mm_set_epi64x_rpl(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]]
                    );
            vNWH = _mm_add_epi64(vNWH, vMat);
            vWH = _mm_max_epi64_rpl(vNWH, vE);
            vWH = _mm_max_epi64_rpl(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi64_rpl(vJ,vNegOne);
                vWH = _mm_blendv_epi8_rpl(vWH, vIBoundary, cond);
                vF = _mm_blendv_epi8_rpl(vF, vNegInf, cond);
                vE = _mm_blendv_epi8_rpl(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWH,0);
            F_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vF,0);
            /* as minor diagonal vector passes across the i or j limit
             * boundary, extract the last value of the column or row */
            {
                __m128i vJeqLimit1 = _mm_cmpeq_epi64_rpl(vJ, vJLimit1);
                __m128i vJgtNegOne = _mm_cmpgt_epi64_rpl(vJ, vNegOne);
                __m128i vJltLimit = _mm_cmplt_epi64_rpl(vJ, vJLimit);
                __m128i cond_j = _mm_and_si128(vIltLimit, vJeqLimit1);
                __m128i cond_i = _mm_and_si128(vIeqLimit1,
                        _mm_and_si128(vJgtNegOne, vJltLimit));
                __m128i cond_max_row = _mm_cmpgt_epi64_rpl(vWH, vMaxHRow);
                __m128i cond_max_col = _mm_cmpgt_epi64_rpl(vWH, vMaxHCol);
                __m128i cond_last_val = _mm_and_si128(vIeqLimit1, vJeqLimit1);
                __m128i cond_all_row = _mm_and_si128(cond_max_row, cond_i);
                __m128i cond_all_col = _mm_and_si128(cond_max_col, cond_j);
                vMaxHRow = _mm_blendv_epi8_rpl(vMaxHRow, vWH, cond_all_row);
                vMaxHCol = _mm_blendv_epi8_rpl(vMaxHCol, vWH, cond_all_col);
                vLastVal = _mm_blendv_epi8_rpl(vLastVal, vWH, cond_last_val);
                vEndI = _mm_blendv_epi8_rpl(vEndI, vI, cond_all_col);
                vEndJ = _mm_blendv_epi8_rpl(vEndJ, vJ, cond_all_row);
            }
            vJ = _mm_add_epi64(vJ, vOne);
        }
        vI = _mm_add_epi64(vI, vN);
        vIBoundary = _mm_sub_epi64(vIBoundary, vGapN);
    }

    /* alignment ending position */
    {
        int64_t max_row = NEG_LIMIT;
        int64_t max_col = NEG_LIMIT;
        int64_t last_val = NEG_LIMIT;
        int64_t *s = (int64_t*)&vMaxHRow;
        int64_t *t = (int64_t*)&vMaxHCol;
        int64_t *u = (int64_t*)&vLastVal;
        int64_t *i = (int64_t*)&vEndI;
        int64_t *j = (int64_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++s, ++t, ++u, ++i, ++j) {
            if (*t > max_col || (*t == max_col && *i < end_query)) {
                max_col = *t;
                end_query = *i;
            }
            if (*s > max_row) {
                max_row = *s;
                end_ref = *j;
            }
            if (*u > last_val) {
                last_val = *u;
            }
        }
        if (s1_end && s2_end) {
            if (max_col > max_row || (max_col == max_row && end_ref == s2Len-1)) {
                score = max_col;
                end_ref = s2Len-1;
            }
            else {
                score = max_row;
                end_query = s1Len-1;
            }
        }
        else if (s1_end) {
            score = max_col;
            end_ref = s2Len-1;
        }
        else if (s2_end) {
            score = max_row;
            end_query = s1Len-1;
        }
        else {
            score = last_val;
            end_query = s1Len-1;
            end_ref = s2Len-1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}